

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<std::pair<double,_QColor>_>::data(QList<std::pair<double,_QColor>_> *this)

{
  QArrayDataPointer<std::pair<double,_QColor>_> *this_00;
  pair<double,_QColor> *ppVar1;
  QArrayDataPointer<std::pair<double,_QColor>_> *in_RDI;
  
  detach((QList<std::pair<double,_QColor>_> *)0x4a697c);
  this_00 = (QArrayDataPointer<std::pair<double,_QColor>_> *)
            QArrayDataPointer<std::pair<double,_QColor>_>::operator->(in_RDI);
  ppVar1 = QArrayDataPointer<std::pair<double,_QColor>_>::data(this_00);
  return ppVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }